

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

void Flatten(ON_PolyCurve *poly,ON_Interval pdom,ON_SimpleArray<double> *new_t,
            ON_SimpleArray<ON_Curve_*> *new_seg)

{
  bool bVar1;
  double *pdVar2;
  ON_PolyCurve *pOVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double t1;
  ON_Curve *seg;
  ON_Interval pcdom;
  ON_Interval local_80;
  double local_70;
  ON_PolyCurve *local_68;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  
  dVar6 = pdom.m_t[1];
  local_40.m_t[0] = pdom.m_t[0];
  lVar4 = (long)(poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_40.m_t[1] = dVar6;
  pdVar2 = ON_Interval::operator[](&local_40,0);
  local_70 = *pdVar2;
  (*(poly->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(poly);
  if (0 < lVar4) {
    lVar5 = 0;
    local_50.m_t[1] = dVar6;
    do {
      local_80 = ON_PolyCurve::SegmentDomain(poly,(int)lVar5);
      pdVar2 = ON_Interval::operator[](&local_80,1);
      dVar6 = ON_Interval::NormalizedParameterAt(&local_50,*pdVar2);
      dVar6 = ON_Interval::ParameterAt(&local_40,dVar6);
      local_80.m_t[0] = dVar6;
      if (lVar5 < (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
        pOVar3 = (ON_PolyCurve *)(poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar5];
      }
      else {
        pOVar3 = (ON_PolyCurve *)0x0;
      }
      local_68 = pOVar3;
      if (pOVar3 == (ON_PolyCurve *)0x0) {
        pOVar3 = (ON_PolyCurve *)0x0;
      }
      else {
        bVar1 = ON_Object::IsKindOf((ON_Object *)pOVar3,&ON_PolyCurve::m_ON_PolyCurve_class_rtti);
        if (!bVar1) {
          pOVar3 = (ON_PolyCurve *)0x0;
        }
      }
      if (pOVar3 == (ON_PolyCurve *)0x0) {
        ON_SimpleArray<double>::Append(new_t,local_80.m_t);
        ON_SimpleArray<ON_Curve_*>::Append(new_seg,(ON_Curve **)&local_68);
        if (lVar5 < (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
          (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar5] = (ON_Curve *)0x0;
        }
      }
      else {
        ON_Interval::ON_Interval(&local_60,local_70,local_80.m_t[0]);
        Flatten(pOVar3,local_60,new_t,new_seg);
        if (lVar5 < (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
          (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar5] = (ON_Curve *)0x0;
        }
        (*(pOVar3->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(pOVar3);
      }
      local_70 = local_80.m_t[0];
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return;
}

Assistant:

static
void Flatten( ON_PolyCurve* poly, ON_Interval pdom, ON_SimpleArray<double>& new_t, ON_SimpleArray<ON_Curve*>& new_seg){
		int n= poly->Count();
		double t0 = pdom[0];
		ON_Interval pcdom = poly->Domain();
		for(int i=0; i<n; i++){
			double sdom=poly->SegmentDomain(i)[1];
			double ndom=pcdom.NormalizedParameterAt(sdom);	
			double t1 =pdom.ParameterAt(ndom);
			ON_Curve* seg = poly->SegmentCurve(i);
			ON_PolyCurve* spoly =  ON_PolyCurve::Cast(seg);
			if(spoly){
				Flatten(spoly, ON_Interval(t0,t1), new_t, new_seg );
				poly->HarvestSegment(i);		
				delete spoly;
			} else {
				new_t.Append(t1);
				new_seg.Append(seg);
				poly->HarvestSegment(i);
			}
			t0 = t1;
		}
}